

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflowsol.cpp
# Opt level: O0

bool __thiscall
ArcflowSol::is_valid
          (ArcflowSol *this,
          vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
          *sol,int btype)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  reference ppVar4;
  const_reference this_01;
  reference pvVar5;
  const_reference this_02;
  const_reference pvVar6;
  int local_b0;
  int local_ac;
  int i_1;
  int i;
  Item *it;
  pair<int,_int> *itpair;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range2;
  allocator<int> local_61;
  undefined1 local_60 [8];
  vector<int,_std::allocator<int>_> w;
  pattern_pair *pat;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *__range1;
  int btype_local;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *sol_local;
  ArcflowSol *this_local;
  
  __end1 = std::
           vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
           ::begin(sol);
  pat = (pattern_pair *)
        std::
        vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
        ::end(sol);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_*,_std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
                                     *)&pat), bVar2) {
    w.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         &__gnu_cxx::
          __normal_iterator<const_std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_*,_std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
          ::operator*(&__end1)->first;
    iVar1 = (this->inst).ndims;
    std::allocator<int>::allocator(&local_61);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_60,(long)iVar1,&local_61);
    std::allocator<int>::~allocator(&local_61);
    this_00 = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
              (w.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage + 2);
    __end2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(this_00)
    ;
    itpair = (pair<int,_int> *)
             std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                       *)&itpair), bVar2) {
      ppVar4 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator*(&__end2);
      if ((((this->inst).binary & 1U) != 0) && (1 < ppVar4->second)) {
        this_local._7_1_ = 0;
        bVar2 = true;
        goto LAB_0012b82a;
      }
      this_01 = std::vector<Item,_std::allocator<Item>_>::operator[]
                          (&(this->inst).items,(long)ppVar4->first);
      for (local_ac = 0; local_ac < (this->inst).ndims; local_ac = local_ac + 1) {
        iVar3 = Item::operator[](this_01,local_ac);
        iVar1 = ppVar4->second;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_60,(long)local_ac);
        *pvVar5 = iVar3 * iVar1 + *pvVar5;
      }
      __gnu_cxx::
      __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator++(&__end2);
    }
    for (local_b0 = 0; local_b0 < (this->inst).ndims; local_b0 = local_b0 + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_60,(long)local_b0);
      iVar1 = *pvVar5;
      this_02 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](&(this->inst).Ws,(long)btype);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_02,(long)local_b0);
      if (*pvVar6 < iVar1) {
        this_local._7_1_ = 0;
        bVar2 = true;
        goto LAB_0012b82a;
      }
    }
    bVar2 = false;
LAB_0012b82a:
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_60);
    if (bVar2) goto LAB_0012b855;
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_*,_std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
    ::operator++(&__end1);
  }
  this_local._7_1_ = 1;
LAB_0012b855:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ArcflowSol::is_valid(const std::vector<pattern_pair> &sol, int btype) const {
	for (const pattern_pair &pat : sol) {
		std::vector<int> w(inst.ndims);
		for (const auto &itpair : pat.second) {
			if (inst.binary && itpair.second > 1) {
				return false;
			}
			const Item &it = inst.items[itpair.first];
			for (int i = 0; i < inst.ndims; i++) {
				w[i] += it[i] * itpair.second;
			}
		}
		for (int i = 0; i < inst.ndims; i++) {
			if (w[i] > inst.Ws[btype][i]) {
				return false;
			}
		}
	}
	return true;
}